

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

TestCaseGroup *
deqp::egl::Image::createSimpleCreationTests(EglTestContext *eglTestCtx,string *name,string *desc)

{
  ImageTests *this;
  long lVar1;
  
  this = (ImageTests *)operator_new(0xc88);
  ImageTests::ImageTests(this,eglTestCtx,name,desc);
  lVar1 = -0x600;
  do {
    *(undefined1 **)((long)&this[1].m_createActions.m_actions[0x1d].label.field_2 + lVar1 + 8) =
         &this[1].m_createActions.m_actions[0x1d].action.
          super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>.
          m_data.field_0x8 + lVar1;
    *(undefined8 *)
     ((long)&this[1].m_createActions.m_actions[0x1d].action.
             super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
             .m_data.ptr + lVar1) = 0;
    (&this[1].m_createActions.m_actions[0x1d].action.
      super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>.
      m_data.field_0x8)[lVar1] = 0;
    *(undefined8 *)((long)&this[1].m_createActions.m_actions[0x1e].label._M_string_length + lVar1) =
         0;
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0);
  *(undefined4 *)((long)&this[1].m_createActions.m_actions[0x1d].label.field_2 + 8) = 0;
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RenderTests_003ef0d8;
  return &this->super_TestCaseGroup;
}

Assistant:

TestCaseGroup* createSimpleCreationTests (EglTestContext& eglTestCtx, const string& name, const string& desc)
{
	return new SimpleCreationTests(eglTestCtx, name, desc);
}